

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<513UL>,_void>
::to_json(json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<513UL>,_void>
          *this,bitset<513UL> *val,allocator_type *alloc)

{
  byte bVar1;
  pointer phVar2;
  byte bVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  size_t i;
  ulong uVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar6;
  uint8_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  byte local_49;
  char_type_conflict1 *local_48;
  iterator iStack_40;
  uchar *local_38;
  
  local_48 = (char_type_conflict1 *)0x0;
  iStack_40._M_current = (uchar *)0x0;
  local_38 = (uchar *)0x0;
  local_49 = 0;
  bVar3 = 0x80;
  bVar1 = 0;
  uVar5 = 0;
  do {
    while( true ) {
      if (((val->super__Base_bitset<9UL>)._M_w[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
        bVar1 = bVar1 | bVar3;
        local_49 = bVar1;
      }
      if (bVar3 < 2) break;
      bVar3 = bVar3 >> 1;
      uVar5 = uVar5 + 1;
      if (uVar5 == 0x201) {
        if (iStack_40._M_current == local_38) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,iStack_40,
                     &local_49);
        }
        else {
          *iStack_40._M_current = bVar1;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        goto LAB_0024e207;
      }
    }
    if (iStack_40._M_current == local_38) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,iStack_40,
                 &local_49);
    }
    else {
      *iStack_40._M_current = bVar1;
      iStack_40._M_current = iStack_40._M_current + 1;
    }
    local_49 = 0;
    uVar5 = uVar5 + 1;
    bVar1 = 0;
    bVar3 = 0x80;
  } while (uVar5 != 0x201);
LAB_0024e207:
  phVar2 = utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::create
                     (local_48,(long)iStack_40._M_current - (long)local_48,0,alloc);
  *(undefined2 *)this = 0x80c;
  *(pointer *)(this + 8) = phVar2;
  uVar4 = extraout_RDX;
  if (local_48 != (char_type_conflict1 *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
    uVar4 = extraout_RDX_00;
  }
  bVar6.field_0.int64_.val_ = uVar4;
  bVar6.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar6.field_0;
}

Assistant:

static Json to_json(const std::bitset<N>& val, 
                            const allocator_type& alloc = allocator_type())
        {
            std::vector<uint8_t> bits;

            uint8_t byte = 0;
            uint8_t mask = 0x80;

            for (std::size_t i = 0; i < N; ++i)
            {
                if (val[i])
                {
                    byte |= mask;
                }

                mask = static_cast<uint8_t>(mask >> 1);

                if (mask == 0)
                {
                    bits.push_back(byte);
                    byte = 0;
                    mask = 0x80;
                }
            }

            // Encode remainder
            if (mask != 0x80)
            {
                bits.push_back(byte);
            }

            Json j(byte_string_arg, bits, semantic_tag::base16, alloc);
            return j;
        }